

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_data_layout.h
# Opt level: O0

void __thiscall
dlib::row_major_layout::
layout<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_5>::set_size
          (layout<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_5> *this,
          size_t nr,size_t nc)

{
  rgb_pixel *prVar1;
  _func_int **in_RDX;
  _func_int **in_RSI;
  memory_manager_stateless_kernel_1<dlib::rgb_pixel> *in_RDI;
  rgb_pixel *in_stack_ffffffffffffffd8;
  
  if (in_RDI->_vptr_memory_manager_stateless_kernel_1 != (_func_int **)0x0) {
    memory_manager_stateless_kernel_1<dlib::rgb_pixel>::deallocate_array
              (in_RDI,in_stack_ffffffffffffffd8);
  }
  prVar1 = memory_manager_stateless_kernel_1<dlib::rgb_pixel>::allocate_array
                     ((memory_manager_stateless_kernel_1<dlib::rgb_pixel> *)this,nr);
  in_RDI->_vptr_memory_manager_stateless_kernel_1 = (_func_int **)prVar1;
  in_RDI[1]._vptr_memory_manager_stateless_kernel_1 = in_RSI;
  in_RDI[2]._vptr_memory_manager_stateless_kernel_1 = in_RDX;
  return;
}

Assistant:

void set_size (
                size_t nr,
                size_t nc
            )
            {
                if (data) 
                {
                    pool.deallocate_array(data);
                }
                data = pool.allocate_array(nr*nc);
                nr_ = nr;
                nc_ = nc;
            }